

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_context.c
# Opt level: O0

int main(int argc,char **argv)

{
  uint uVar1;
  uint uVar2;
  testcase_digest *td;
  testcase_cipher *tc;
  int ret;
  char *in_stack_000001b8;
  int in_stack_00000468;
  int in_stack_0000046c;
  char *in_stack_00000470;
  testcase_digest *local_28;
  testcase_cipher *name;
  uint local_14;
  
  local_14 = 0;
  OPENSSL_init_crypto(0x4c,0);
  for (name = testcases_ciphers; name->name != (char *)0x0; name = name + 1) {
    uVar1 = test_contexts_cipher(in_stack_00000470,in_stack_0000046c,in_stack_00000468);
    uVar2 = test_contexts_cipher(in_stack_00000470,in_stack_0000046c,in_stack_00000468);
    local_14 = uVar2 | uVar1 | local_14;
  }
  for (local_28 = testcases_digests; local_28->name != (char *)0x0; local_28 = local_28 + 1) {
    if (local_28->mac == 0) {
      uVar1 = test_contexts_digest((char *)name);
    }
    else {
      uVar1 = test_contexts_mac(in_stack_000001b8);
    }
    local_14 = uVar1 | local_14;
  }
  if (local_14 == 0) {
    printf("\x1b[0;32m= All tests passed!\x1b[m\n");
  }
  else {
    printf("\x1b[0;31m= Some tests FAILED!\x1b[m\n");
  }
  return local_14;
}

Assistant:

int main(int argc, char **argv)
{
    int ret = 0;

    OPENSSL_add_all_algorithms_conf();

    const struct testcase_cipher *tc;
    for (tc = testcases_ciphers; tc->name; tc++) {
	ret |= test_contexts_cipher(tc->name, 1, tc->acpkm);
	ret |= test_contexts_cipher(tc->name, 0, tc->acpkm);
    }
    const struct testcase_digest *td;
    for (td = testcases_digests; td->name; td++) {
        if (td->mac)
            ret |= test_contexts_mac(td->name);
        else
            ret |= test_contexts_digest(td->name);
    }

    if (ret)
	printf(cDRED "= Some tests FAILED!" cNORM "\n");
    else
	printf(cDGREEN "= All tests passed!" cNORM "\n");
    return ret;
}